

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::splitPages(Config *this,string *parameter)

{
  int iVar1;
  
  if (parameter->_M_string_length == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = QUtil::string_to_int((parameter->_M_dataplus)._M_p);
  }
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  split_pages = iVar1;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::splitPages(std::string const& parameter)
{
    int n = (parameter.empty() ? 1 : QUtil::string_to_int(parameter.c_str()));
    o.m->split_pages = n;
    return this;
}